

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

int __thiscall ArgParser::ArgIterator::count(ArgIterator *this)

{
  range_error *this_00;
  logic_error *plVar1;
  bool bVar2;
  char *local_28;
  char *q;
  char opt;
  ArgIterator *this_local;
  
  if (this->i == this->argc) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"arg out of range");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  if ((this->longmatch & 1U) == 0) {
    local_28 = this->p;
    do {
      local_28 = local_28 + 1;
      bVar2 = false;
      if (local_28 != this->pend) {
        bVar2 = *local_28 == this->p[1];
      }
    } while (bVar2);
    if (local_28 == this->pend) {
      return ((int)this->pend - (int)this->p) + -1;
    }
    plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar1,"counted options must all be equal");
    __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar1,"can\'t count a --long option");
  __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int count()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (longmatch)
                throw std::logic_error("can't count a --long option");
            char opt = p[1];
            const char *q = p+1;

            while (q!=pend && *q==opt)
                ++q;

            if (q!=pend)
                throw std::logic_error("counted options must all be equal");

            return pend - p - 1;
        }